

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

int main(void)

{
  int iVar1;
  time_t tVar2;
  GLFWwindow *handle;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int height;
  int width;
  GLsizei local_38;
  GLsizei local_34;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = glfwCreateWindow(0x280,0x1e0,"Event Wait Timeout Test",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSetKeyCallback(handle,key_callback);
      iVar1 = glfwWindowShouldClose(handle);
      if (iVar1 == 0) {
        do {
          iVar1 = rand();
          fVar5 = (float)iVar1 * 4.656613e-10;
          iVar1 = rand();
          fVar3 = (float)iVar1 * 4.656613e-10;
          iVar1 = rand();
          fVar6 = (float)iVar1 * 4.656613e-10;
          fVar4 = fVar6 * fVar6 + fVar5 * fVar5 + fVar3 * fVar3;
          if (fVar4 < 0.0) {
            fVar4 = sqrtf(fVar4);
          }
          else {
            fVar4 = SQRT(fVar4);
          }
          glfwGetFramebufferSize(handle,&local_34,&local_38);
          (*glad_glViewport)(0,0,local_34,local_38);
          (*glad_glClearColor)(fVar5 / fVar4,fVar3 / fVar4,fVar6 / fVar4,1.0);
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwWaitEventsTimeout(1.0);
          iVar1 = glfwWindowShouldClose(handle);
        } while (iVar1 == 0);
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Event Wait Timeout Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        float r = nrand(), g = nrand(), b = nrand();
        float l = (float) sqrt(r * r + g * g + b * b);

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClearColor(r / l, g / l, b / l, 1.f);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);

        glfwWaitEventsTimeout(1.0);
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}